

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
          (AssertionResult *__return_storage_ptr__,iutest *this,char *pred_str,char *params,
          _func_bool_int_int_int_int_int_int *pred,int args,int args_1,int args_2,int args_3,
          int args_4,int args_5)

{
  char cVar1;
  AssertionResult *pAVar2;
  int in_stack_ffffffffffffff68;
  int args_local;
  AssertionResult *local_90;
  char *params_local;
  char *pred_str_local;
  string local_78;
  AssertionResult local_58;
  
  args_local = (int)pred;
  params_local = pred_str;
  pred_str_local = (char *)this;
  cVar1 = (*(code *)params)((ulong)pred & 0xffffffff,args,args_1,args_2,args_3,args_4);
  if (cVar1 == '\0') {
    local_58.m_message._M_dataplus._M_p = (pointer)&local_58.m_message.field_2;
    local_58.m_message._M_string_length = 0;
    local_58.m_message.field_2._M_local_buf[0] = '\0';
    local_58.m_result = false;
    pAVar2 = AssertionResult::operator<<(&local_58,(char (*) [8])"error: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&pred_str_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x19dfcd);
    pAVar2 = AssertionResult::operator<<(pAVar2,&params_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") evaluates to false, where ");
    local_90 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x19aef7);
    PrintToStrings<int,int,int,int,int,int>
              (&local_78,(iutest *)0x19aef7,(char *)&args_local,(int *)(ulong)(uint)args,args_1,
               args_2,args_3,args_4,in_stack_ffffffffffffff68);
    pAVar2 = AssertionResult::operator<<(local_90,&local_78);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult AssertPredVariadicHelper(const char* pred_str, const char* params
    , PRED pred, Args... args)
{
    if IUTEST_COND_LIKELY( (*pred)(args...) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "("
        << params << ") evaluates to false, where "
        << "\n" << PrintToStrings("\n", args...);
}